

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void mbedtls_des_setkey(uint32_t *SK,uchar *key)

{
  sbyte sVar1;
  uint uVar2;
  sbyte sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar6 = (uint)key[3] | (uint)key[1] << 0x10 | (uint)*key << 0x18 | (uint)key[2] << 8;
  uVar2 = *(uint *)(key + 4);
  uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = (uVar4 >> 4 ^ uVar6) & 0xf0f0f0f;
  uVar5 = uVar2 ^ uVar6;
  uVar2 = (uVar2 << 4 ^ uVar4) & 0xefefefef | uVar6 & 0x10101010;
  uVar4 = (LHs[*key >> 5] << 4 |
           *(int *)((long)LHs + (ulong)(uVar5 >> 0x13 & 0x3c)) << 5 |
           *(int *)((long)LHs + (ulong)(uVar5 >> 0xb & 0x3c)) << 6 |
           *(int *)((long)LHs + (ulong)(uVar5 >> 3 & 0x3c)) << 7 |
          *(int *)((long)LHs + (ulong)(uVar5 >> 0xe & 0x3c)) * 2 |
          *(int *)((long)LHs + (ulong)(uVar5 >> 6 & 0x3c)) << 2 | LHs[uVar5 & 0xf] << 3 |
          *(uint *)((long)LHs + (ulong)(uVar5 >> 0x16 & 0x3c))) & 0xfffffff;
  uVar2 = (RHs[uVar2 >> 0x1c] << 4 |
           *(int *)((long)RHs + (ulong)(uVar2 >> 0x12 & 0x3c)) << 5 |
           *(int *)((long)RHs + (ulong)(uVar2 >> 10 & 0x3c)) << 6 |
           *(int *)((long)RHs + (ulong)(uVar2 >> 2 & 0x3c)) << 7 |
          *(int *)((long)RHs + (ulong)(uVar2 >> 0xf & 0x3c)) * 2 |
          *(int *)((long)RHs + (ulong)(uVar2 >> 7 & 0x3c)) << 2 |
          *(int *)((long)RHs + (ulong)(uVar2 & 0x1e) * 2) << 3 |
          *(uint *)((long)RHs + (ulong)(uVar2 >> 0x17 & 0x3c))) & 0xfffffff;
  lVar7 = 0;
  do {
    uVar5 = (uint)lVar7;
    if (uVar5 < 0x11) {
      uVar6 = 0xffffffe;
      sVar1 = 1;
      sVar3 = 0x1b;
      if ((0x8103U >> (uVar5 & 0x1f) & 1) == 0) {
        if (uVar5 == 0x10) {
          return;
        }
        goto LAB_00128e4b;
      }
    }
    else {
LAB_00128e4b:
      uVar6 = 0xffffffc;
      sVar1 = 2;
      sVar3 = 0x1a;
    }
    uVar12 = uVar4 << sVar1;
    uVar9 = uVar4 >> sVar3;
    uVar11 = uVar12 & uVar6;
    uVar4 = uVar11 | uVar9;
    uVar10 = uVar2 << sVar1;
    uVar8 = uVar2 >> sVar3;
    uVar2 = uVar6 & uVar10 | uVar8;
    uVar5 = (uVar6 & uVar10) >> 0xe;
    SK[lVar7 * 2] =
         uVar10 >> 0x18 & 1 | uVar10 >> 0x1a & 2 |
         uVar10 >> 0x12 & 4 |
         uVar2 >> 3 & 8 |
         uVar10 >> 10 & 0x10 |
         uVar10 >> 5 & 0x20 | uVar5 & 0x200 | uVar10 >> 1 & 0x400 | (uVar2 & 0x20) << 6 |
         uVar10 & 0x100 | uVar12 >> 10 & 0x10000 | uVar11 * 4 & 0x20000 | uVar4 << 10 & 0x40000 |
         uVar10 >> 0xd & 0x2000 | uVar10 >> 4 & 0x1000 |
         uVar12 >> 1 & 0x100000 |
         (uVar12 & 0x1000) << 9 |
         (uVar12 & 0x40000) << 6 |
         (uVar4 & 0x82) << 0x12 |
         (uVar12 & 0x2000) << 0xe | (uVar9 & 1) << 0x1c | (uVar11 & 0x2400000) << 4;
    SK[lVar7 * 2 + 1] =
         uVar10 >> 0x15 & 2 |
         (uVar8 & 1) << 2 |
         uVar2 >> 3 & 0x11 |
         uVar10 >> 7 & 0x20 | (uVar2 & 2) << 7 | uVar10 >> 9 & 0x400 | uVar5 & 0x808 |
         uVar10 & 0x200 |
         uVar12 >> 4 & 0x10000 |
         uVar4 << 0xf & 0x20000 |
         uVar12 >> 6 & 0x40000 | (uVar11 & 0x10000) << 3 | (uVar12 & 0x200) << 0xb |
         uVar10 >> 2 & 0x2000 | (uVar2 & 0x10) << 8 |
         (uVar4 & 0x20) << 0x10 |
         (uVar12 >> 2 & 0x2000000 |
         (uVar4 & 0x10) << 0x16 |
         uVar4 << 10 & 0x8000000 | (uVar12 & 0x800) << 0x11 | uVar4 << 0xf & 0x20000000) +
         (uVar11 & 0x800000) * 2;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void mbedtls_des_setkey( uint32_t SK[32], const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;
    uint32_t X, Y, T;

    GET_UINT32_BE( X, key, 0 );
    GET_UINT32_BE( Y, key, 4 );

    /*
     * Permuted Choice 1
     */
    T =  ((Y >>  4) ^ X) & 0x0F0F0F0F;  X ^= T; Y ^= (T <<  4);
    T =  ((Y      ) ^ X) & 0x10101010;  X ^= T; Y ^= (T      );

    X =   (LHs[ (X      ) & 0xF] << 3) | (LHs[ (X >>  8) & 0xF ] << 2)
        | (LHs[ (X >> 16) & 0xF] << 1) | (LHs[ (X >> 24) & 0xF ]     )
        | (LHs[ (X >>  5) & 0xF] << 7) | (LHs[ (X >> 13) & 0xF ] << 6)
        | (LHs[ (X >> 21) & 0xF] << 5) | (LHs[ (X >> 29) & 0xF ] << 4);

    Y =   (RHs[ (Y >>  1) & 0xF] << 3) | (RHs[ (Y >>  9) & 0xF ] << 2)
        | (RHs[ (Y >> 17) & 0xF] << 1) | (RHs[ (Y >> 25) & 0xF ]     )
        | (RHs[ (Y >>  4) & 0xF] << 7) | (RHs[ (Y >> 12) & 0xF ] << 6)
        | (RHs[ (Y >> 20) & 0xF] << 5) | (RHs[ (Y >> 28) & 0xF ] << 4);

    X &= 0x0FFFFFFF;
    Y &= 0x0FFFFFFF;

    /*
     * calculate subkeys
     */
    for( i = 0; i < 16; i++ )
    {
        if( i < 2 || i == 8 || i == 15 )
        {
            X = ((X <<  1) | (X >> 27)) & 0x0FFFFFFF;
            Y = ((Y <<  1) | (Y >> 27)) & 0x0FFFFFFF;
        }
        else
        {
            X = ((X <<  2) | (X >> 26)) & 0x0FFFFFFF;
            Y = ((Y <<  2) | (Y >> 26)) & 0x0FFFFFFF;
        }

        *SK++ =   ((X <<  4) & 0x24000000) | ((X << 28) & 0x10000000)
                | ((X << 14) & 0x08000000) | ((X << 18) & 0x02080000)
                | ((X <<  6) & 0x01000000) | ((X <<  9) & 0x00200000)
                | ((X >>  1) & 0x00100000) | ((X << 10) & 0x00040000)
                | ((X <<  2) & 0x00020000) | ((X >> 10) & 0x00010000)
                | ((Y >> 13) & 0x00002000) | ((Y >>  4) & 0x00001000)
                | ((Y <<  6) & 0x00000800) | ((Y >>  1) & 0x00000400)
                | ((Y >> 14) & 0x00000200) | ((Y      ) & 0x00000100)
                | ((Y >>  5) & 0x00000020) | ((Y >> 10) & 0x00000010)
                | ((Y >>  3) & 0x00000008) | ((Y >> 18) & 0x00000004)
                | ((Y >> 26) & 0x00000002) | ((Y >> 24) & 0x00000001);

        *SK++ =   ((X << 15) & 0x20000000) | ((X << 17) & 0x10000000)
                | ((X << 10) & 0x08000000) | ((X << 22) & 0x04000000)
                | ((X >>  2) & 0x02000000) | ((X <<  1) & 0x01000000)
                | ((X << 16) & 0x00200000) | ((X << 11) & 0x00100000)
                | ((X <<  3) & 0x00080000) | ((X >>  6) & 0x00040000)
                | ((X << 15) & 0x00020000) | ((X >>  4) & 0x00010000)
                | ((Y >>  2) & 0x00002000) | ((Y <<  8) & 0x00001000)
                | ((Y >> 14) & 0x00000808) | ((Y >>  9) & 0x00000400)
                | ((Y      ) & 0x00000200) | ((Y <<  7) & 0x00000100)
                | ((Y >>  7) & 0x00000020) | ((Y >>  3) & 0x00000011)
                | ((Y <<  2) & 0x00000004) | ((Y >> 21) & 0x00000002);
    }
}